

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::AddHIPArchitectureFlags(cmGeneratorTarget *this,string *flags)

{
  cmMakefile *this_00;
  pointer pbVar1;
  bool bVar2;
  string *psVar3;
  string *__rhs;
  size_type sVar4;
  pointer __rhs_00;
  string_view value;
  string_view arg;
  string sStack_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_68,"HIP_ARCHITECTURES",(allocator<char> *)&options);
  psVar3 = GetSafeProperty(this,&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  sVar4 = psVar3->_M_string_length;
  if (sVar4 == 0) {
    this_00 = this->Makefile;
    __rhs = GetName_abi_cxx11_(this);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options,
                   "HIP_ARCHITECTURES is empty for target \"",__rhs);
    std::operator+(&sStack_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options,
                   "\".");
    cmMakefile::IssueMessage(this_00,FATAL_ERROR,&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
    std::__cxx11::string::~string((string *)&options);
    sVar4 = psVar3->_M_string_length;
  }
  value._M_str = (psVar3->_M_dataplus)._M_p;
  value._M_len = sVar4;
  bVar2 = cmValue::IsOff(value);
  if (!bVar2) {
    options.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    options.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    options.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    arg._M_str = (psVar3->_M_dataplus)._M_p;
    arg._M_len = psVar3->_M_string_length;
    cmExpandList(arg,&options,false);
    pbVar1 = options.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__rhs_00 = options.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; __rhs_00 != pbVar1;
        __rhs_00 = __rhs_00 + 1) {
      std::operator+(&sStack_68," --offload-arch=",__rhs_00);
      std::__cxx11::string::append((string *)flags);
      std::__cxx11::string::~string((string *)&sStack_68);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&options);
  }
  return;
}

Assistant:

void cmGeneratorTarget::AddHIPArchitectureFlags(std::string& flags) const
{
  const std::string& property = this->GetSafeProperty("HIP_ARCHITECTURES");

  if (property.empty()) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 "HIP_ARCHITECTURES is empty for target \"" +
                                   this->GetName() + "\".");
  }

  // If HIP_ARCHITECTURES is false we don't add any architectures.
  if (cmIsOff(property)) {
    return;
  }

  std::vector<std::string> options;
  cmExpandList(property, options);

  for (std::string& option : options) {
    flags += " --offload-arch=" + option;
  }
}